

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void cppcms_capi_session_pool_delete(cppcms_capi_session_pool *pool)

{
  pointer pcVar1;
  
  if (pool != (cppcms_capi_session_pool *)0x0) {
    booster::hold_ptr<cppcms::session_pool>::~hold_ptr(&pool->p);
    pcVar1 = (pool->e).s_msg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(pool->e).s_msg.field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(pool);
    return;
  }
  return;
}

Assistant:

void cppcms_capi_session_pool_delete(cppcms_capi_session_pool *pool)
{
	if(pool)
		delete pool;
}